

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O0

int run_test_eintr_handling(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_e8;
  size_t local_e0;
  undefined1 local_d0 [4];
  int nread;
  uv_signal_t signal;
  uv_thread_t thread;
  thread_ctx ctx;
  
  uVar3 = uv_buf_init(buf,0x20);
  local_e8 = uVar3.base;
  iov.base = local_e8;
  local_e0 = uVar3.len;
  iov.len = local_e0;
  loop = uv_default_loop();
  iVar1 = uv_signal_init(loop,(uv_signal_t *)local_d0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x49,"0 == uv_signal_init(loop, &signal)");
    abort();
  }
  iVar1 = uv_signal_start((uv_signal_t *)local_d0,sig_func,10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x4a,"0 == uv_signal_start(&signal, sig_func, SIGUSR1)");
    abort();
  }
  iVar1 = pipe(pipe_fds);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x4c,"0 == pipe(pipe_fds)");
    abort();
  }
  iVar1 = uv_thread_create((uv_thread_t *)&signal.caught_signals,thread_main,&thread);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x4d,"0 == uv_thread_create(&thread, thread_main, &ctx)");
    abort();
  }
  iVar1 = uv_fs_read(loop,&read_req,pipe_fds[0],&iov,1,-1,(uv_fs_cb)0x0);
  if (iVar1 != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x51,"nread == sizeof(test_buf)");
    abort();
  }
  iVar1 = strcmp(buf,test_buf);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x52,"0 == strcmp(buf, test_buf)");
    abort();
  }
  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x54,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = close(pipe_fds[0]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x56,"0 == close(pipe_fds[0])");
    abort();
  }
  iVar1 = close(pipe_fds[1]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x57,"0 == close(pipe_fds[1])");
    abort();
  }
  uv_close((uv_handle_t *)local_d0,(uv_close_cb)0x0);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-eintr-handling.c"
            ,0x5a,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(eintr_handling) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int nread;

  iov = uv_buf_init(buf, sizeof(buf));
  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  nread = uv_fs_read(loop, &read_req, pipe_fds[0], &iov, 1, -1, NULL);

  ASSERT(nread == sizeof(test_buf));
  ASSERT(0 == strcmp(buf, test_buf));

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[0]));
  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  MAKE_VALGRIND_HAPPY();
  return 0;
}